

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::BVHNIntersector1<8,_16781328,_true,_embree::avx512::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  char cVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar62 [32];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  vfloat4 a0;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar85 [64];
  undefined1 in_ZMM16 [64];
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  int iVar20;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    if (0.0 <= ray->tfar) {
      aVar3 = (ray->dir).field_0.field_1;
      auVar23 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
      auVar8 = ZEXT812(0) << 0x20;
      auVar26 = ZEXT816(0) << 0x40;
      auVar68._4_12_ = auVar8;
      auVar68._0_4_ = auVar23._0_4_;
      auVar21 = vrsqrt14ss_avx512f(auVar26,auVar68);
      fVar67 = auVar21._0_4_;
      local_1218[0] = fVar67 * 1.5 - auVar23._0_4_ * 0.5 * fVar67 * fVar67 * fVar67;
      uVar1 = *(undefined4 *)&(ray->dir).field_0;
      uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar67 = (ray->dir).field_0.m128[2];
      auVar72._0_4_ = aVar3.x * local_1218[0];
      auVar72._4_4_ = aVar3.y * local_1218[0];
      auVar72._8_4_ = aVar3.z * local_1218[0];
      auVar72._12_4_ = aVar3.field_3.w * local_1218[0];
      auVar21 = vshufpd_avx(auVar72,auVar72,1);
      auVar23 = vmovshdup_avx(auVar72);
      auVar79._8_4_ = 0x80000000;
      auVar79._0_8_ = 0x8000000080000000;
      auVar79._12_4_ = 0x80000000;
      auVar77._0_4_ = auVar23._0_4_ ^ 0x80000000;
      auVar23 = vunpckhps_avx(auVar72,auVar26);
      auVar77._4_12_ = auVar8;
      auVar25 = vshufps_avx(auVar23,auVar77,0x41);
      auVar23 = vdpps_avx(auVar25,auVar25,0x7f);
      auVar74._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
      auVar74._8_8_ = auVar21._8_8_ ^ auVar79._8_8_;
      auVar22 = vinsertps_avx(auVar74,auVar72,0x2a);
      auVar21 = vdpps_avx(auVar22,auVar22,0x7f);
      uVar5 = vcmpps_avx512vl(auVar21,auVar23,1);
      auVar23 = vpmovm2d_avx512vl(uVar5);
      auVar80._0_4_ = auVar23._0_4_;
      auVar80._4_4_ = auVar80._0_4_;
      auVar80._8_4_ = auVar80._0_4_;
      auVar80._12_4_ = auVar80._0_4_;
      uVar19 = vpmovd2m_avx512vl(auVar80);
      auVar23 = vpcmpeqd_avx(auVar80,auVar80);
      auVar21._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar23._4_4_;
      auVar21._0_4_ = (uint)((byte)uVar19 & 1) * auVar23._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar23._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar23._12_4_;
      auVar23 = vblendvps_avx(auVar22,auVar25,auVar21);
      auVar21 = vdpps_avx(auVar23,auVar23,0x7f);
      auVar64._4_12_ = auVar8;
      auVar64._0_4_ = auVar21._0_4_;
      auVar22 = vrsqrt14ss_avx512f(auVar26,auVar64);
      fVar63 = auVar22._0_4_;
      fVar63 = fVar63 * 1.5 - auVar21._0_4_ * 0.5 * fVar63 * fVar63 * fVar63;
      auVar65._0_4_ = auVar23._0_4_ * fVar63;
      auVar65._4_4_ = auVar23._4_4_ * fVar63;
      auVar65._8_4_ = auVar23._8_4_ * fVar63;
      auVar65._12_4_ = auVar23._12_4_ * fVar63;
      auVar23 = vshufps_avx(auVar65,auVar65,0xc9);
      auVar21 = vshufps_avx(auVar72,auVar72,0xc9);
      auVar78._0_4_ = auVar21._0_4_ * auVar65._0_4_;
      auVar78._4_4_ = auVar21._4_4_ * auVar65._4_4_;
      auVar78._8_4_ = auVar21._8_4_ * auVar65._8_4_;
      auVar78._12_4_ = auVar21._12_4_ * auVar65._12_4_;
      auVar23 = vfmsub231ps_fma(auVar78,auVar72,auVar23);
      auVar21 = vshufps_avx(auVar23,auVar23,0xc9);
      auVar75 = ZEXT1664(auVar21);
      auVar23 = vdpps_avx(auVar21,auVar21,0x7f);
      auVar81._4_12_ = auVar8;
      auVar81._0_4_ = auVar23._0_4_;
      auVar22 = vrsqrt14ss_avx512f(auVar26,auVar81);
      fVar63 = auVar22._0_4_;
      fVar63 = fVar63 * 1.5 - auVar23._0_4_ * 0.5 * fVar63 * fVar63 * fVar63;
      auVar70._0_4_ = auVar21._0_4_ * fVar63;
      auVar70._4_4_ = auVar21._4_4_ * fVar63;
      auVar70._8_4_ = auVar21._8_4_ * fVar63;
      auVar70._12_4_ = auVar21._12_4_ * fVar63;
      auVar69._0_4_ = local_1218[0] * auVar72._0_4_;
      auVar69._4_4_ = local_1218[0] * auVar72._4_4_;
      auVar69._8_4_ = local_1218[0] * auVar72._8_4_;
      auVar69._12_4_ = local_1218[0] * auVar72._12_4_;
      auVar22 = vunpcklps_avx(auVar65,auVar69);
      auVar23 = vunpckhps_avx(auVar65,auVar69);
      auVar25 = vunpcklps_avx(auVar70,auVar26);
      auVar21 = vunpckhps_avx(auVar70,auVar26);
      local_11e8 = vunpcklps_avx(auVar23,auVar21);
      local_1208 = vunpcklps_avx(auVar22,auVar25);
      local_11f8 = vunpckhps_avx(auVar22,auVar25);
      auVar21 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl((undefined1  [16])aVar3,auVar23);
      auVar22._8_4_ = 0x219392ef;
      auVar22._0_8_ = 0x219392ef219392ef;
      auVar22._12_4_ = 0x219392ef;
      uVar19 = vcmpps_avx512vl(auVar23,auVar22,1);
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      puVar15 = local_11d0;
      auVar23 = vdivps_avx(auVar66,(undefined1  [16])aVar3);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar18 = (bool)((byte)uVar19 & 1);
      auVar24._0_4_ = (uint)bVar18 * auVar22._0_4_ | (uint)!bVar18 * auVar23._0_4_;
      bVar18 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar18 * auVar22._4_4_ | (uint)!bVar18 * auVar23._4_4_;
      bVar18 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar18 * auVar22._8_4_ | (uint)!bVar18 * auVar23._8_4_;
      bVar18 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar18 * auVar22._12_4_ | (uint)!bVar18 * auVar23._12_4_;
      auVar25._8_4_ = 0x3f7ffffa;
      auVar25._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar25._12_4_ = 0x3f7ffffa;
      auVar25 = vmulps_avx512vl(auVar24,auVar25);
      auVar26._8_4_ = 0x3f800003;
      auVar26._0_8_ = 0x3f8000033f800003;
      auVar26._12_4_ = 0x3f800003;
      auVar26 = vmulps_avx512vl(auVar24,auVar26);
      auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar30 = vbroadcastss_avx512vl(auVar25);
      auVar23 = vmovshdup_avx(auVar25);
      auVar31 = vbroadcastsd_avx512vl(auVar23);
      auVar22 = vshufpd_avx(auVar25,auVar25,1);
      auVar35._8_4_ = 2;
      auVar35._0_8_ = 0x200000002;
      auVar35._12_4_ = 2;
      auVar35._16_4_ = 2;
      auVar35._20_4_ = 2;
      auVar35._24_4_ = 2;
      auVar35._28_4_ = 2;
      auVar32 = vpermps_avx512vl(auVar35,ZEXT1632(auVar25));
      auVar33 = vbroadcastss_avx512vl(auVar26);
      auVar34._8_4_ = 1;
      auVar34._0_8_ = 0x100000001;
      auVar34._12_4_ = 1;
      auVar34._16_4_ = 1;
      auVar34._20_4_ = 1;
      auVar34._24_4_ = 1;
      auVar34._28_4_ = 1;
      auVar34 = vpermps_avx512vl(auVar34,ZEXT1632(auVar26));
      auVar35 = vpermps_avx512vl(auVar35,ZEXT1632(auVar26));
      uVar17 = (ulong)(auVar25._0_4_ < 0.0) * 0x20;
      uVar16 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      uVar19 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x80;
      auVar36 = vbroadcastss_avx512vl(auVar21);
      auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
LAB_0068f71a:
      do {
        if (puVar15 == &local_11d8) {
          return;
        }
        uVar11 = puVar15[-1];
        puVar15 = puVar15 + -1;
        while ((uVar11 & 8) == 0) {
          fVar63 = (ray->dir).field_0.m128[3];
          uVar13 = (uint)uVar11 & 7;
          uVar10 = uVar11 & 0xfffffffffffffff0;
          if (uVar13 == 3) {
            auVar38 = *(undefined1 (*) [32])(uVar10 + 0x100);
            auVar39 = *(undefined1 (*) [32])(uVar10 + 0x120);
            auVar40 = *(undefined1 (*) [32])(uVar10 + 0x140);
            fVar4 = 1.0 - fVar63;
            auVar82._4_4_ = fVar4;
            auVar82._0_4_ = fVar4;
            auVar82._8_4_ = fVar4;
            auVar82._12_4_ = fVar4;
            auVar82._16_4_ = fVar4;
            auVar82._20_4_ = fVar4;
            auVar82._24_4_ = fVar4;
            auVar82._28_4_ = fVar4;
            auVar76._0_4_ = fVar63 * *(float *)(uVar10 + 0x1c0);
            auVar76._4_4_ = fVar63 * *(float *)(uVar10 + 0x1c4);
            auVar76._8_4_ = fVar63 * *(float *)(uVar10 + 0x1c8);
            auVar76._12_4_ = fVar63 * *(float *)(uVar10 + 0x1cc);
            auVar76._16_4_ = fVar63 * *(float *)(uVar10 + 0x1d0);
            auVar76._20_4_ = fVar63 * *(float *)(uVar10 + 0x1d4);
            auVar76._28_36_ = auVar75._28_36_;
            auVar76._24_4_ = fVar63 * *(float *)(uVar10 + 0x1d8);
            auVar73._0_4_ = fVar63 * *(float *)(uVar10 + 0x1e0);
            auVar73._4_4_ = fVar63 * *(float *)(uVar10 + 0x1e4);
            auVar73._8_4_ = fVar63 * *(float *)(uVar10 + 0x1e8);
            auVar73._12_4_ = fVar63 * *(float *)(uVar10 + 0x1ec);
            auVar73._16_4_ = fVar63 * *(float *)(uVar10 + 0x1f0);
            auVar73._20_4_ = fVar63 * *(float *)(uVar10 + 500);
            auVar73._24_4_ = fVar63 * *(float *)(uVar10 + 0x1f8);
            auVar73._28_4_ = 0;
            auVar71._0_4_ = fVar63 * *(float *)(uVar10 + 0x200);
            auVar71._4_4_ = fVar63 * *(float *)(uVar10 + 0x204);
            auVar71._8_4_ = fVar63 * *(float *)(uVar10 + 0x208);
            auVar71._12_4_ = fVar63 * *(float *)(uVar10 + 0x20c);
            auVar71._16_4_ = fVar63 * *(float *)(uVar10 + 0x210);
            auVar71._20_4_ = fVar63 * *(float *)(uVar10 + 0x214);
            auVar71._24_4_ = fVar63 * *(float *)(uVar10 + 0x218);
            auVar71._28_4_ = 0;
            auVar23 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            auVar42 = vfmadd231ps_avx512vl(auVar76._0_32_,auVar82,ZEXT1632(auVar23));
            auVar75 = ZEXT3264(auVar42);
            auVar43 = vfmadd231ps_avx512vl(auVar73,auVar82,ZEXT1632(auVar23));
            auVar83._0_4_ = fVar63 * *(float *)(uVar10 + 0x220);
            auVar83._4_4_ = fVar63 * *(float *)(uVar10 + 0x224);
            auVar83._8_4_ = fVar63 * *(float *)(uVar10 + 0x228);
            auVar83._12_4_ = fVar63 * *(float *)(uVar10 + 0x22c);
            auVar83._16_4_ = fVar63 * *(float *)(uVar10 + 0x230);
            auVar83._20_4_ = fVar63 * *(float *)(uVar10 + 0x234);
            auVar83._28_36_ = in_ZMM14._28_36_;
            auVar83._24_4_ = fVar63 * *(float *)(uVar10 + 0x238);
            auVar85._0_4_ = fVar63 * *(float *)(uVar10 + 0x240);
            auVar85._4_4_ = fVar63 * *(float *)(uVar10 + 0x244);
            auVar85._8_4_ = fVar63 * *(float *)(uVar10 + 0x248);
            auVar85._12_4_ = fVar63 * *(float *)(uVar10 + 0x24c);
            auVar85._16_4_ = fVar63 * *(float *)(uVar10 + 0x250);
            auVar85._20_4_ = fVar63 * *(float *)(uVar10 + 0x254);
            auVar85._28_36_ = in_ZMM15._28_36_;
            auVar85._24_4_ = fVar63 * *(float *)(uVar10 + 600);
            auVar44 = vfmadd231ps_avx512vl(auVar71,auVar82,ZEXT1632(auVar23));
            auVar45 = vaddps_avx512vl(auVar82,auVar83._0_32_);
            auVar46 = vaddps_avx512vl(auVar82,auVar85._0_32_);
            in_ZMM16 = ZEXT3264(auVar46);
            auVar84._0_4_ = fVar4 + fVar63 * *(float *)(uVar10 + 0x260);
            auVar84._4_4_ = fVar4 + fVar63 * *(float *)(uVar10 + 0x264);
            auVar84._8_4_ = fVar4 + fVar63 * *(float *)(uVar10 + 0x268);
            auVar84._12_4_ = fVar4 + fVar63 * *(float *)(uVar10 + 0x26c);
            auVar84._16_4_ = fVar4 + fVar63 * *(float *)(uVar10 + 0x270);
            auVar84._20_4_ = fVar4 + fVar63 * *(float *)(uVar10 + 0x274);
            auVar84._24_4_ = fVar4 + fVar63 * *(float *)(uVar10 + 0x278);
            auVar84._28_4_ = fVar4 + fVar63;
            in_ZMM15 = ZEXT3264(auVar84);
            auVar41._4_4_ = fVar67 * auVar38._4_4_;
            auVar41._0_4_ = fVar67 * auVar38._0_4_;
            auVar41._8_4_ = fVar67 * auVar38._8_4_;
            auVar41._12_4_ = fVar67 * auVar38._12_4_;
            auVar41._16_4_ = fVar67 * auVar38._16_4_;
            auVar41._20_4_ = fVar67 * auVar38._20_4_;
            auVar41._24_4_ = fVar67 * auVar38._24_4_;
            auVar41._28_4_ = in_ZMM14._28_4_;
            auVar47._4_4_ = fVar67 * auVar39._4_4_;
            auVar47._0_4_ = fVar67 * auVar39._0_4_;
            auVar47._8_4_ = fVar67 * auVar39._8_4_;
            auVar47._12_4_ = fVar67 * auVar39._12_4_;
            auVar47._16_4_ = fVar67 * auVar39._16_4_;
            auVar47._20_4_ = fVar67 * auVar39._20_4_;
            auVar47._24_4_ = fVar67 * auVar39._24_4_;
            auVar47._28_4_ = fVar63;
            auVar48._4_4_ = fVar67 * auVar40._4_4_;
            auVar48._0_4_ = fVar67 * auVar40._0_4_;
            auVar48._8_4_ = fVar67 * auVar40._8_4_;
            auVar48._12_4_ = fVar67 * auVar40._12_4_;
            auVar48._16_4_ = fVar67 * auVar40._16_4_;
            auVar48._20_4_ = fVar67 * auVar40._20_4_;
            auVar48._24_4_ = fVar67 * auVar40._24_4_;
            auVar48._28_4_ = fVar67;
            auVar50._4_4_ = uVar2;
            auVar50._0_4_ = uVar2;
            auVar50._8_4_ = uVar2;
            auVar50._12_4_ = uVar2;
            auVar50._16_4_ = uVar2;
            auVar50._20_4_ = uVar2;
            auVar50._24_4_ = uVar2;
            auVar50._28_4_ = uVar2;
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar50,*(undefined1 (*) [32])(uVar10 + 0xa0));
            auVar47 = vfmadd231ps_avx512vl(auVar47,auVar50,*(undefined1 (*) [32])(uVar10 + 0xc0));
            auVar48 = vfmadd231ps_avx512vl(auVar48,auVar50,*(undefined1 (*) [32])(uVar10 + 0xe0));
            auVar54._4_4_ = uVar1;
            auVar54._0_4_ = uVar1;
            auVar54._8_4_ = uVar1;
            auVar54._12_4_ = uVar1;
            auVar54._16_4_ = uVar1;
            auVar54._20_4_ = uVar1;
            auVar54._24_4_ = uVar1;
            auVar54._28_4_ = uVar1;
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar54,*(undefined1 (*) [32])(uVar10 + 0x40));
            auVar47 = vfmadd231ps_avx512vl(auVar47,auVar54,*(undefined1 (*) [32])(uVar10 + 0x60));
            auVar48 = vfmadd231ps_avx512vl(auVar48,auVar54,*(undefined1 (*) [32])(uVar10 + 0x80));
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar41,auVar49);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            uVar11 = vcmpps_avx512vl(auVar49,auVar50,1);
            bVar18 = (bool)((byte)uVar11 & 1);
            iVar20 = auVar50._0_4_;
            auVar51._0_4_ = (uint)bVar18 * iVar20 | (uint)!bVar18 * auVar41._0_4_;
            bVar18 = (bool)((byte)(uVar11 >> 1) & 1);
            iVar55 = auVar50._4_4_;
            auVar51._4_4_ = (uint)bVar18 * iVar55 | (uint)!bVar18 * auVar41._4_4_;
            bVar18 = (bool)((byte)(uVar11 >> 2) & 1);
            iVar56 = auVar50._8_4_;
            auVar51._8_4_ = (uint)bVar18 * iVar56 | (uint)!bVar18 * auVar41._8_4_;
            bVar18 = (bool)((byte)(uVar11 >> 3) & 1);
            iVar57 = auVar50._12_4_;
            auVar51._12_4_ = (uint)bVar18 * iVar57 | (uint)!bVar18 * auVar41._12_4_;
            bVar18 = (bool)((byte)(uVar11 >> 4) & 1);
            iVar58 = auVar50._16_4_;
            auVar51._16_4_ = (uint)bVar18 * iVar58 | (uint)!bVar18 * auVar41._16_4_;
            bVar18 = (bool)((byte)(uVar11 >> 5) & 1);
            iVar59 = auVar50._20_4_;
            auVar51._20_4_ = (uint)bVar18 * iVar59 | (uint)!bVar18 * auVar41._20_4_;
            bVar18 = (bool)((byte)(uVar11 >> 6) & 1);
            iVar60 = auVar50._24_4_;
            iVar61 = auVar50._28_4_;
            auVar51._24_4_ = (uint)bVar18 * iVar60 | (uint)!bVar18 * auVar41._24_4_;
            bVar18 = SUB81(uVar11 >> 7,0);
            auVar51._28_4_ = (uint)bVar18 * iVar61 | (uint)!bVar18 * auVar41._28_4_;
            vandps_avx512vl(auVar47,auVar49);
            uVar11 = vcmpps_avx512vl(auVar51,auVar50,1);
            bVar18 = (bool)((byte)uVar11 & 1);
            auVar52._0_4_ = (uint)bVar18 * iVar20 | (uint)!bVar18 * auVar47._0_4_;
            bVar18 = (bool)((byte)(uVar11 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar18 * iVar55 | (uint)!bVar18 * auVar47._4_4_;
            bVar18 = (bool)((byte)(uVar11 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar18 * iVar56 | (uint)!bVar18 * auVar47._8_4_;
            bVar18 = (bool)((byte)(uVar11 >> 3) & 1);
            auVar52._12_4_ = (uint)bVar18 * iVar57 | (uint)!bVar18 * auVar47._12_4_;
            bVar18 = (bool)((byte)(uVar11 >> 4) & 1);
            auVar52._16_4_ = (uint)bVar18 * iVar58 | (uint)!bVar18 * auVar47._16_4_;
            bVar18 = (bool)((byte)(uVar11 >> 5) & 1);
            auVar52._20_4_ = (uint)bVar18 * iVar59 | (uint)!bVar18 * auVar47._20_4_;
            bVar18 = (bool)((byte)(uVar11 >> 6) & 1);
            auVar52._24_4_ = (uint)bVar18 * iVar60 | (uint)!bVar18 * auVar47._24_4_;
            bVar18 = SUB81(uVar11 >> 7,0);
            auVar52._28_4_ = (uint)bVar18 * iVar61 | (uint)!bVar18 * auVar47._28_4_;
            vandps_avx512vl(auVar48,auVar49);
            uVar11 = vcmpps_avx512vl(auVar52,auVar50,1);
            bVar18 = (bool)((byte)uVar11 & 1);
            auVar53._0_4_ = (uint)bVar18 * iVar20 | (uint)!bVar18 * auVar48._0_4_;
            bVar18 = (bool)((byte)(uVar11 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar18 * iVar55 | (uint)!bVar18 * auVar48._4_4_;
            bVar18 = (bool)((byte)(uVar11 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar18 * iVar56 | (uint)!bVar18 * auVar48._8_4_;
            bVar18 = (bool)((byte)(uVar11 >> 3) & 1);
            auVar53._12_4_ = (uint)bVar18 * iVar57 | (uint)!bVar18 * auVar48._12_4_;
            bVar18 = (bool)((byte)(uVar11 >> 4) & 1);
            auVar53._16_4_ = (uint)bVar18 * iVar58 | (uint)!bVar18 * auVar48._16_4_;
            bVar18 = (bool)((byte)(uVar11 >> 5) & 1);
            auVar53._20_4_ = (uint)bVar18 * iVar59 | (uint)!bVar18 * auVar48._20_4_;
            bVar18 = (bool)((byte)(uVar11 >> 6) & 1);
            auVar53._24_4_ = (uint)bVar18 * iVar60 | (uint)!bVar18 * auVar48._24_4_;
            bVar18 = SUB81(uVar11 >> 7,0);
            auVar53._28_4_ = (uint)bVar18 * iVar61 | (uint)!bVar18 * auVar48._28_4_;
            auVar41 = vrcp14ps_avx512vl(auVar51);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar48 = vfnmadd213ps_avx512vl(auVar51,auVar41,auVar47);
            auVar48 = vfmadd132ps_avx512vl(auVar48,auVar41,auVar41);
            in_ZMM14 = ZEXT3264(auVar48);
            auVar41 = vrcp14ps_avx512vl(auVar52);
            auVar49 = vfnmadd213ps_avx512vl(auVar52,auVar41,auVar47);
            auVar49 = vfmadd132ps_avx512vl(auVar49,auVar41,auVar41);
            auVar41 = vrcp14ps_avx512vl(auVar53);
            auVar47 = vfnmadd213ps_avx512vl(auVar53,auVar41,auVar47);
            auVar47 = vfmadd132ps_avx512vl(auVar47,auVar41,auVar41);
            auVar38 = vfmadd213ps_avx512vl(auVar38,auVar29,*(undefined1 (*) [32])(uVar10 + 0x160));
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar28,*(undefined1 (*) [32])(uVar10 + 0xa0));
            auVar39 = vfmadd213ps_avx512vl(auVar39,auVar29,*(undefined1 (*) [32])(uVar10 + 0x180));
            auVar39 = vfmadd231ps_avx512vl(auVar39,auVar28,*(undefined1 (*) [32])(uVar10 + 0xc0));
            auVar40 = vfmadd213ps_avx512vl(auVar40,auVar29,*(undefined1 (*) [32])(uVar10 + 0x1a0));
            auVar40 = vfmadd231ps_avx512vl(auVar40,auVar28,*(undefined1 (*) [32])(uVar10 + 0xe0));
            auVar41 = vfmadd231ps_avx512vl(auVar38,auVar27,*(undefined1 (*) [32])(uVar10 + 0x40));
            auVar50 = vfmadd231ps_avx512vl(auVar39,auVar27,*(undefined1 (*) [32])(uVar10 + 0x60));
            auVar54 = vfmadd231ps_avx512vl(auVar40,auVar27,*(undefined1 (*) [32])(uVar10 + 0x80));
            auVar38 = vsubps_avx(auVar42,auVar41);
            auVar45 = vsubps_avx512vl(auVar45,auVar41);
            auVar39 = vsubps_avx(auVar43,auVar50);
            auVar50 = vsubps_avx512vl(auVar46,auVar50);
            auVar40 = vsubps_avx(auVar44,auVar54);
            auVar41 = vsubps_avx(auVar84,auVar54);
            auVar42._4_4_ = auVar48._4_4_ * auVar38._4_4_;
            auVar42._0_4_ = auVar48._0_4_ * auVar38._0_4_;
            auVar42._8_4_ = auVar48._8_4_ * auVar38._8_4_;
            auVar42._12_4_ = auVar48._12_4_ * auVar38._12_4_;
            auVar42._16_4_ = auVar48._16_4_ * auVar38._16_4_;
            auVar42._20_4_ = auVar48._20_4_ * auVar38._20_4_;
            auVar42._24_4_ = auVar48._24_4_ * auVar38._24_4_;
            auVar42._28_4_ = auVar38._28_4_;
            auVar43._4_4_ = auVar48._4_4_ * auVar45._4_4_;
            auVar43._0_4_ = auVar48._0_4_ * auVar45._0_4_;
            auVar43._8_4_ = auVar48._8_4_ * auVar45._8_4_;
            auVar43._12_4_ = auVar48._12_4_ * auVar45._12_4_;
            auVar43._16_4_ = auVar48._16_4_ * auVar45._16_4_;
            auVar43._20_4_ = auVar48._20_4_ * auVar45._20_4_;
            auVar43._24_4_ = auVar48._24_4_ * auVar45._24_4_;
            auVar43._28_4_ = auVar45._28_4_;
            auVar44._4_4_ = auVar49._4_4_ * auVar39._4_4_;
            auVar44._0_4_ = auVar49._0_4_ * auVar39._0_4_;
            auVar44._8_4_ = auVar49._8_4_ * auVar39._8_4_;
            auVar44._12_4_ = auVar49._12_4_ * auVar39._12_4_;
            auVar44._16_4_ = auVar49._16_4_ * auVar39._16_4_;
            auVar44._20_4_ = auVar49._20_4_ * auVar39._20_4_;
            auVar44._24_4_ = auVar49._24_4_ * auVar39._24_4_;
            auVar44._28_4_ = auVar39._28_4_;
            auVar45._4_4_ = auVar47._4_4_ * auVar40._4_4_;
            auVar45._0_4_ = auVar47._0_4_ * auVar40._0_4_;
            auVar45._8_4_ = auVar47._8_4_ * auVar40._8_4_;
            auVar45._12_4_ = auVar47._12_4_ * auVar40._12_4_;
            auVar45._16_4_ = auVar47._16_4_ * auVar40._16_4_;
            auVar45._20_4_ = auVar47._20_4_ * auVar40._20_4_;
            auVar45._24_4_ = auVar47._24_4_ * auVar40._24_4_;
            auVar45._28_4_ = auVar40._28_4_;
            auVar46._4_4_ = auVar49._4_4_ * auVar50._4_4_;
            auVar46._0_4_ = auVar49._0_4_ * auVar50._0_4_;
            auVar46._8_4_ = auVar49._8_4_ * auVar50._8_4_;
            auVar46._12_4_ = auVar49._12_4_ * auVar50._12_4_;
            auVar46._16_4_ = auVar49._16_4_ * auVar50._16_4_;
            auVar46._20_4_ = auVar49._20_4_ * auVar50._20_4_;
            auVar46._24_4_ = auVar49._24_4_ * auVar50._24_4_;
            auVar46._28_4_ = auVar50._28_4_;
            auVar49._4_4_ = auVar47._4_4_ * auVar41._4_4_;
            auVar49._0_4_ = auVar47._0_4_ * auVar41._0_4_;
            auVar49._8_4_ = auVar47._8_4_ * auVar41._8_4_;
            auVar49._12_4_ = auVar47._12_4_ * auVar41._12_4_;
            auVar49._16_4_ = auVar47._16_4_ * auVar41._16_4_;
            auVar49._20_4_ = auVar47._20_4_ * auVar41._20_4_;
            auVar49._24_4_ = auVar47._24_4_ * auVar41._24_4_;
            auVar49._28_4_ = auVar41._28_4_;
            auVar38 = vpminsd_avx2(auVar44,auVar46);
            auVar39 = vpminsd_avx2(auVar45,auVar49);
            auVar38 = vmaxps_avx(auVar38,auVar39);
            auVar47 = vpminsd_avx2(auVar42,auVar43);
            auVar40 = vpmaxsd_avx2(auVar42,auVar43);
            auVar39 = vpmaxsd_avx2(auVar44,auVar46);
            auVar41 = vpmaxsd_avx2(auVar45,auVar49);
            auVar39 = vminps_avx(auVar39,auVar41);
            auVar41 = vmaxps_avx512vl(auVar36,auVar47);
            auVar38 = vmaxps_avx(auVar41,auVar38);
            auVar40 = vminps_avx512vl(auVar37,auVar40);
            auVar39 = vminps_avx(auVar40,auVar39);
            auVar40._8_4_ = 0x3f7ffffa;
            auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
            auVar40._12_4_ = 0x3f7ffffa;
            auVar40._16_4_ = 0x3f7ffffa;
            auVar40._20_4_ = 0x3f7ffffa;
            auVar40._24_4_ = 0x3f7ffffa;
            auVar40._28_4_ = 0x3f7ffffa;
            auVar40 = vmulps_avx512vl(auVar38,auVar40);
            auVar38._8_4_ = 0x3f800003;
            auVar38._0_8_ = 0x3f8000033f800003;
            auVar38._12_4_ = 0x3f800003;
            auVar38._16_4_ = 0x3f800003;
            auVar38._20_4_ = 0x3f800003;
            auVar38._24_4_ = 0x3f800003;
            auVar38._28_4_ = 0x3f800003;
            auVar38 = vmulps_avx512vl(auVar39,auVar38);
            uVar5 = vcmpps_avx512vl(auVar40,auVar38,2);
            uVar13 = (uint)uVar5;
          }
          else {
            auVar62._4_4_ = fVar63;
            auVar62._0_4_ = fVar63;
            auVar62._8_4_ = fVar63;
            auVar62._12_4_ = fVar63;
            auVar62._16_4_ = fVar63;
            auVar62._20_4_ = fVar63;
            auVar62._24_4_ = fVar63;
            auVar62._28_4_ = fVar63;
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar17),auVar62,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar17));
            auVar38 = vsubps_avx512vl(ZEXT1632(auVar23),auVar27);
            auVar39 = vmulps_avx512vl(auVar30,auVar38);
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar16),auVar62,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar16));
            auVar38 = vsubps_avx512vl(ZEXT1632(auVar23),auVar28);
            auVar38 = vmulps_avx512vl(auVar31,auVar38);
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar19),auVar62,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar19));
            auVar40 = vsubps_avx512vl(ZEXT1632(auVar23),auVar29);
            auVar40 = vmulps_avx512vl(auVar32,auVar40);
            auVar38 = vmaxps_avx(auVar38,auVar40);
            auVar39 = vmaxps_avx512vl(auVar36,auVar39);
            auVar38 = vmaxps_avx(auVar39,auVar38);
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar17 ^ 0x20)),
                                      auVar62,*(undefined1 (*) [32])
                                               (uVar10 + 0x40 + (uVar17 ^ 0x20)));
            auVar39 = vsubps_avx512vl(ZEXT1632(auVar23),auVar27);
            auVar40 = vmulps_avx512vl(auVar33,auVar39);
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar16 ^ 0x20)),
                                      auVar62,*(undefined1 (*) [32])
                                               (uVar10 + 0x40 + (uVar16 ^ 0x20)));
            auVar39 = vsubps_avx512vl(ZEXT1632(auVar23),auVar28);
            auVar39 = vmulps_avx512vl(auVar34,auVar39);
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar19 ^ 0x20)),
                                      auVar62,*(undefined1 (*) [32])
                                               (uVar10 + 0x40 + (uVar19 ^ 0x20)));
            auVar41 = vsubps_avx512vl(ZEXT1632(auVar23),auVar29);
            auVar41 = vmulps_avx512vl(auVar35,auVar41);
            auVar39 = vminps_avx(auVar39,auVar41);
            auVar40 = vminps_avx512vl(auVar37,auVar40);
            auVar39 = vminps_avx(auVar40,auVar39);
            if (uVar13 == 6) {
              uVar5 = vcmpps_avx512vl(auVar38,auVar39,2);
              uVar6 = vcmpps_avx512vl(auVar62,*(undefined1 (*) [32])(uVar10 + 0x1c0),0xd);
              uVar7 = vcmpps_avx512vl(auVar62,*(undefined1 (*) [32])(uVar10 + 0x1e0),1);
              uVar13 = (uint)uVar5 & (uint)uVar6 & (uint)uVar7;
            }
            else {
              uVar5 = vcmpps_avx512vl(auVar38,auVar39,2);
              uVar13 = (uint)uVar5;
            }
          }
          if ((byte)uVar13 == 0) goto LAB_0068f71a;
          lVar12 = 0;
          for (uVar11 = (ulong)(byte)uVar13; (uVar11 & 1) == 0;
              uVar11 = uVar11 >> 1 | 0x8000000000000000) {
            lVar12 = lVar12 + 1;
          }
          uVar11 = *(ulong *)(uVar10 + lVar12 * 8);
          uVar13 = (uVar13 & 0xff) - 1 & uVar13 & 0xff;
          uVar14 = (ulong)uVar13;
          if (uVar13 != 0) {
            *puVar15 = uVar11;
            lVar12 = 0;
            for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            uVar13 = uVar13 - 1 & uVar13;
            uVar14 = (ulong)uVar13;
            bVar18 = uVar13 == 0;
            while( true ) {
              puVar15 = puVar15 + 1;
              uVar11 = *(ulong *)(uVar10 + lVar12 * 8);
              if (bVar18) break;
              *puVar15 = uVar11;
              lVar12 = 0;
              for (uVar11 = uVar14; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                lVar12 = lVar12 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              bVar18 = uVar14 == 0;
            }
          }
        }
        auVar75 = ZEXT1664(auVar75._0_16_);
        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
        in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
        cVar9 = (**(code **)((long)This->leafIntersector +
                            (ulong)*(byte *)(uVar11 & 0xfffffffffffffff0) * 0x40 + 8))
                          (local_1218,ray,context);
      } while (cVar9 == '\0');
      ray->tfar = -INFINITY;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }